

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

bool __thiscall
re2::Prog::SearchBitState
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  bool bVar1;
  int nsubmatch;
  StringPiece *submatch;
  StringPiece sp0;
  BitState b;
  StringPiece local_b8;
  BitState local_a8;
  
  local_b8.data_ = (const_pointer)0x0;
  local_b8.size_ = 0;
  nsubmatch = 1;
  if (1 < nmatch) {
    nsubmatch = nmatch;
  }
  submatch = match;
  if (nmatch < 1) {
    submatch = &local_b8;
  }
  if (kind != kFullMatch) {
    submatch = match;
    nsubmatch = nmatch;
  }
  local_a8.submatch_ = (StringPiece *)0x0;
  local_a8.nsubmatch_ = 0;
  local_a8.text_.data_ = (const_pointer)0x0;
  local_a8.text_.size_ = 0;
  local_a8.context_.data_ = (const_pointer)0x0;
  local_a8.context_.size_._0_7_ = 0;
  local_a8._39_4_ = 0;
  local_a8.visited_.ptr_._M_t.
  super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
  super__Tuple_impl<1UL,_re2::PODArray<unsigned_int>::Deleter>.
  super__Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>._M_head_impl.len_ =
       (_Head_base<1UL,_re2::PODArray<unsigned_int>::Deleter,_false>)0x0;
  local_a8.visited_.ptr_._M_t.
  super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>._4_4_ = 0;
  local_a8.visited_.ptr_._M_t.
  super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
  super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
  local_a8.cap_.ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
  super__Tuple_impl<1UL,_re2::PODArray<const_char_*>::Deleter>.
  super__Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false>._M_head_impl.len_ =
       (_Head_base<1UL,_re2::PODArray<const_char_*>::Deleter,_false>)0x0;
  local_a8.cap_.ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>._4_4_ = 0;
  local_a8.cap_.ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  local_a8.job_.ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
  super__Tuple_impl<1UL,_re2::PODArray<re2::Job>::Deleter>.
  super__Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false>._M_head_impl.len_ =
       (_Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false>)0x0;
  local_a8.job_.ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>._4_4_ = 0;
  local_a8.job_.ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
  super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl = (Job *)0x0;
  local_a8.njob_ = 0;
  local_a8.prog_ = this;
  bVar1 = BitState::Search(&local_a8,text,context,anchor == kAnchored || kind == kFullMatch,
                           kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch < 1) {
        match = &local_b8;
      }
      if (submatch->data_ + match->size_ != text->data_ + text->size_) goto LAB_001bbb0c;
    }
    bVar1 = true;
  }
  else {
LAB_001bbb0c:
    bVar1 = false;
  }
  if (local_a8.job_.ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t
      .super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
      super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl != (Job *)0x0) {
    operator_delete(local_a8.job_.ptr_._M_t.
                    super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
                    super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl);
  }
  local_a8.job_.ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
  super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl = (Job *)0x0;
  if (local_a8.cap_.ptr_._M_t.
      super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
      super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
      super__Head_base<0UL,_const_char_**,_false>._M_head_impl != (char **)0x0) {
    operator_delete(local_a8.cap_.ptr_._M_t.
                    super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
                    super__Head_base<0UL,_const_char_**,_false>._M_head_impl);
  }
  local_a8.cap_.ptr_._M_t.super___uniq_ptr_impl<const_char_*,_re2::PODArray<const_char_*>::Deleter>.
  _M_t.super__Tuple_impl<0UL,_const_char_**,_re2::PODArray<const_char_*>::Deleter>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  if (local_a8.visited_.ptr_._M_t.
      super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
    operator_delete(local_a8.visited_.ptr_._M_t.
                    super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
                    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
  }
  return bVar1;
}

Assistant:

bool Prog::SearchBitState(const StringPiece& text,
                          const StringPiece& context,
                          Anchor anchor,
                          MatchKind kind,
                          StringPiece* match,
                          int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  BitState b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}